

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

void __thiscall wasm::RemoveUnusedBrs::optimizeSwitch(RemoveUnusedBrs *this,Switch *curr)

{
  ArenaVector<wasm::Name> *this_00;
  Name *pNVar1;
  Module *pMVar2;
  size_t sVar3;
  Name *pNVar4;
  char *pcVar5;
  Index IVar6;
  ulong uVar7;
  Const *pCVar8;
  Binary *pBVar9;
  Drop *this_01;
  Break *pBVar10;
  Block *this_02;
  LocalSet *this_03;
  Expression *pEVar11;
  Break *pBVar12;
  If *this_04;
  char *in_RCX;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  Type in_R8;
  int iVar16;
  MixedArena *pMVar17;
  optional<wasm::Type> type;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Builder local_38;
  Builder builder;
  
  this_00 = &curr->targets;
  uVar15 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  while (uVar15 != 0) {
    in_RCX = (char *)(uVar15 * 0x10);
    if (*(char **)(in_RCX + (long)&(curr->targets).
                                   super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
                                   [-1].super_IString.str._M_str) !=
        (curr->default_).super_IString.str._M_str) {
      in_RCX = (curr->default_).super_IString.str._M_str;
      uVar14 = 0;
      goto LAB_00a81b75;
    }
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::pop_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    uVar15 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
  }
  goto LAB_00a81c48;
  while (uVar14 = (ulong)((int)uVar14 + 1), uVar14 < uVar15) {
LAB_00a81b75:
    if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar14].
        super_IString.str._M_str != in_RCX) break;
  }
  iVar16 = (int)uVar14;
  if (iVar16 != 0) {
    if (uVar14 < uVar15) {
      in_RCX = (char *)(ulong)(iVar16 + 1U);
      uVar13 = 0;
      uVar7 = uVar14;
      do {
        if (uVar15 <= uVar13) goto LAB_00a820e2;
        pNVar1 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
        pNVar4 = pNVar1 + uVar7;
        pcVar5 = (pNVar4->super_IString).str._M_str;
        pNVar1 = pNVar1 + uVar13;
        (pNVar1->super_IString).str._M_len = (pNVar4->super_IString).str._M_len;
        (pNVar1->super_IString).str._M_str = pcVar5;
        uVar7 = (ulong)(iVar16 + 1U + uVar13);
        uVar15 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                 usedElements;
        uVar13 = uVar13 + 1;
      } while (uVar7 < uVar15);
    }
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar15 - uVar14)
    ;
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
         ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.currModule
    ;
    pEVar11 = curr->condition;
    pCVar8 = Builder::makeConst<int>(&local_38,iVar16);
    pBVar9 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar9->op = SubInt32;
    pBVar9->left = pEVar11;
    pBVar9->right = (Expression *)pCVar8;
    Binary::finalize(pBVar9);
    curr->condition = (Expression *)pBVar9;
  }
LAB_00a81c48:
  if (curr->value == (Expression *)0x0) {
    uVar15 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
    if (uVar15 == 1) {
      pEVar11 = curr->condition;
      sVar3 = (curr->default_).super_IString.str._M_len;
      pcVar5 = (curr->default_).super_IString.str._M_str;
      pMVar17 = &((this->
                  super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                  ).
                  super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                  .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
                 currModule)->allocator;
      pBVar10 = (Break *)MixedArena::allocSpace(pMVar17,0x30,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar10->name).super_IString.str._M_len = sVar3;
      (pBVar10->name).super_IString.str._M_str = pcVar5;
      pBVar10->value = (Expression *)0x0;
      pBVar10->condition = (Expression *)0x0;
      Break::finalize(pBVar10);
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements ==
          0) {
LAB_00a82101:
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xe3,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::front() const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      pNVar4 = (this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data;
      sVar3 = (pNVar4->super_IString).str._M_len;
      pcVar5 = (pNVar4->super_IString).str._M_str;
      pBVar12 = (Break *)MixedArena::allocSpace(pMVar17,0x30,8);
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar12->name).super_IString.str._M_len = sVar3;
      (pBVar12->name).super_IString.str._M_str = pcVar5;
      pBVar12->value = (Expression *)0x0;
      pBVar12->condition = (Expression *)0x0;
      Break::finalize(pBVar12);
      uVar15 = 0x28;
      this_02 = (Block *)MixedArena::allocSpace(pMVar17,0x28,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = IfId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_02->name).super_IString.str._M_len = (size_t)pEVar11;
      (this_02->name).super_IString.str._M_str = (char *)pBVar10;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)pBVar12;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
      If::finalize((If *)this_02,type_);
    }
    else if (uVar15 == 0) {
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
           ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
           currModule;
      pEVar11 = curr->condition;
      pMVar17 = &(local_38.wasm)->allocator;
      this_01 = (Drop *)MixedArena::allocSpace(pMVar17,0x18,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_01->value = pEVar11;
      Drop::finalize(this_01);
      sVar3 = (curr->default_).super_IString.str._M_len;
      pcVar5 = (curr->default_).super_IString.str._M_str;
      pBVar10 = (Break *)MixedArena::allocSpace(pMVar17,0x30,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar10->name).super_IString.str._M_len = sVar3;
      (pBVar10->name).super_IString.str._M_str = pcVar5;
      pBVar10->value = (Expression *)0x0;
      pBVar10->condition = (Expression *)0x0;
      Break::finalize(pBVar10);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
      this_02 = Builder::makeSequence(&local_38,(Expression *)this_01,(Expression *)pBVar10,type);
    }
    else {
      iVar16 = (((this->
                 super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                 ).super_Pass.runner)->options).shrinkLevel;
      if ((uVar15 < 0xd || iVar16 < 1) && (uVar15 < 0x80 || 0 < iVar16)) {
        return;
      }
      uVar14 = 1;
      uVar13 = 2;
      do {
        if (uVar15 <= uVar14) {
LAB_00a820e2:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                       );
        }
        if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar14].
            super_IString.str._M_str != (curr->default_).super_IString.str._M_str) {
          return;
        }
        uVar14 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 < uVar15 - 1);
      pMVar2 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
               ).
               super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
               super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
               currModule;
      local_38.wasm = pMVar2;
      IVar6 = Builder::addVar((Builder *)
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                              ).
                              super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                              .
                              super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                              .currFunction,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
      pEVar11 = curr->condition;
      pMVar17 = &pMVar2->allocator;
      this_03 = (LocalSet *)MixedArena::allocSpace(pMVar17,0x20,8);
      (this_03->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId
      ;
      (this_03->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      this_03->index = IVar6;
      this_03->value = pEVar11;
      LocalSet::makeTee(this_03,(Type)0x2);
      pEVar11 = (Expression *)MixedArena::allocSpace(pMVar17,0x18,8);
      pEVar11->_id = LocalGetId;
      *(Index *)(pEVar11 + 1) = IVar6;
      (pEVar11->type).id = 2;
      pCVar8 = Builder::makeConst<int>
                         (&local_38,
                          (int)(curr->targets).
                               super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                               usedElements + -1);
      pBVar9 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar9->op = EqInt32;
      pBVar9->left = pEVar11;
      pBVar9->right = (Expression *)pCVar8;
      Binary::finalize(pBVar9);
      sVar3 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements;
      if (sVar3 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::back() const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      pNVar4 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data +
               (sVar3 - 1);
      sVar3 = (pNVar4->super_IString).str._M_len;
      pcVar5 = (pNVar4->super_IString).str._M_str;
      pBVar10 = (Break *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar10->name).super_IString.str._M_len = sVar3;
      (pBVar10->name).super_IString.str._M_str = pcVar5;
      pBVar10->value = (Expression *)0x0;
      pBVar10->condition = (Expression *)0x0;
      Break::finalize(pBVar10);
      sVar3 = (curr->default_).super_IString.str._M_len;
      pcVar5 = (curr->default_).super_IString.str._M_str;
      pBVar12 = (Break *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar12->name).super_IString.str._M_len = sVar3;
      (pBVar12->name).super_IString.str._M_str = pcVar5;
      pBVar12->value = (Expression *)0x0;
      pBVar12->condition = (Expression *)0x0;
      Break::finalize(pBVar12);
      uVar15 = 0x28;
      this_04 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
      (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
      this_04->condition = (Expression *)pBVar9;
      this_04->ifTrue = (Expression *)pBVar10;
      this_04->ifFalse = (Expression *)pBVar12;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
      If::finalize(this_04,type__00);
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements ==
          0) goto LAB_00a82101;
      pNVar4 = (this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data;
      sVar3 = (pNVar4->super_IString).str._M_len;
      pcVar5 = (pNVar4->super_IString).str._M_str;
      pBVar10 = (Break *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar10->name).super_IString.str._M_len = sVar3;
      (pBVar10->name).super_IString.str._M_str = pcVar5;
      pBVar10->value = (Expression *)0x0;
      pBVar10->condition = (Expression *)0x0;
      Break::finalize(pBVar10);
      uVar15 = 0x28;
      this_02 = (Block *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = IfId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_02->name).super_IString.str._M_len = (size_t)this_03;
      (this_02->name).super_IString.str._M_str = (char *)this_04;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)pBVar10;
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
      If::finalize((If *)this_02,type__01);
    }
    Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                ).
                super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>,
               (Expression *)this_02);
  }
  return;
}

Assistant:

void optimizeSwitch(Switch* curr) {
    // if the final element is the default, we don't need it
    while (!curr->targets.empty() && curr->targets.back() == curr->default_) {
      curr->targets.pop_back();
    }
    // if the first element is the default, we can remove it by shifting
    // everything (which does add a subtraction of a constant, but often that is
    // worth it as the constant can be folded away and/or we remove multiple
    // elements here)
    Index removable = 0;
    while (removable < curr->targets.size() &&
           curr->targets[removable] == curr->default_) {
      removable++;
    }
    if (removable > 0) {
      for (Index i = removable; i < curr->targets.size(); i++) {
        curr->targets[i - removable] = curr->targets[i];
      }
      curr->targets.resize(curr->targets.size() - removable);
      Builder builder(*getModule());
      curr->condition = builder.makeBinary(
        SubInt32, curr->condition, builder.makeConst(int32_t(removable)));
    }
    // when there isn't a value, we can do some trivial optimizations without
    // worrying about the value being executed before the condition
    if (curr->value) {
      return;
    }
    if (curr->targets.size() == 0) {
      // a switch with just a default always goes there
      Builder builder(*getModule());
      replaceCurrent(builder.makeSequence(builder.makeDrop(curr->condition),
                                          builder.makeBreak(curr->default_)));
    } else if (curr->targets.size() == 1) {
      // a switch with two options is basically an if
      Builder builder(*getModule());
      replaceCurrent(builder.makeIf(curr->condition,
                                    builder.makeBreak(curr->default_),
                                    builder.makeBreak(curr->targets.front())));
    } else {
      // there are also some other cases where we want to convert a switch into
      // ifs, especially if the switch is large and we are focusing on size. an
      // especially egregious case is a switch like this: [a b b [..] b b c]
      // with default b (which may be arrived at after we trim away excess
      // default values on both sides). in this case, we really have 3 values in
      // a simple form, so it is the next logical case after handling 1 and 2
      // values right above here. to optimize this, we must add a local + a
      // bunch of nodes (if*2, tee, eq, get, const, break*3), so the table must
      // be big enough for it to make sense

      // How many targets we need when shrinking. This is literally the size at
      // which the transformation begins to be smaller.
      const uint32_t MIN_SHRINK = 13;
      // How many targets we need when not shrinking, in which case, 2 ifs may
      // be slower, so we do this when the table is ridiculously large for one
      // with just 3 values in it.
      const uint32_t MIN_GENERAL = 128;

      auto shrink = getPassRunner()->options.shrinkLevel > 0;
      if ((curr->targets.size() >= MIN_SHRINK && shrink) ||
          (curr->targets.size() >= MIN_GENERAL && !shrink)) {
        for (Index i = 1; i < curr->targets.size() - 1; i++) {
          if (curr->targets[i] != curr->default_) {
            return;
          }
        }
        // great, we are in that case, optimize
        Builder builder(*getModule());
        auto temp = builder.addVar(getFunction(), Type::i32);
        Expression* z;
        replaceCurrent(z = builder.makeIf(
                         builder.makeLocalTee(temp, curr->condition, Type::i32),
                         builder.makeIf(builder.makeBinary(
                                          EqInt32,
                                          builder.makeLocalGet(temp, Type::i32),
                                          builder.makeConst(
                                            int32_t(curr->targets.size() - 1))),
                                        builder.makeBreak(curr->targets.back()),
                                        builder.makeBreak(curr->default_)),
                         builder.makeBreak(curr->targets.front())));
      }
    }
  }